

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCopyMultiPartFile.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_f2215::checkPixels<float>
          (anon_unknown_dwarf_f2215 *this,Array2D<unsigned_int> *sampleCount,Array2D<float_*> *ph,
          int width,int height)

{
  ostream *poVar1;
  long *plVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  bool bVar8;
  float fVar9;
  
  if (0 < height) {
    uVar7 = 0;
    bVar8 = false;
    do {
      if (0 < width) {
        uVar5 = 0;
        do {
          uVar4 = (ulong)*(uint *)((long)&sampleCount->_sizeX + uVar5 * 4 + uVar7 * (long)this * 4);
          if (uVar4 != 0) {
            iVar6 = ((int)uVar5 + (int)uVar7 * width) % 0x801;
            fVar9 = (float)iVar6;
            uVar3 = 0;
            do {
              if ((ph->_data[uVar7 * ph->_sizeY + uVar5][uVar3] != fVar9) ||
                 (NAN(ph->_data[uVar7 * ph->_sizeY + uVar5][uVar3]) || NAN(fVar9))) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"value at ",9);
                poVar1 = (ostream *)std::ostream::operator<<(&std::cout,(int)uVar5);
                std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
                poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)uVar7);
                std::__ostream_insert<char,std::char_traits<char>>(poVar1,", sample ",9);
                poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
                std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
                poVar1 = std::ostream::_M_insert<double>
                                   ((double)ph->_data[uVar7 * ph->_sizeY + uVar5][uVar3]);
                std::__ostream_insert<char,std::char_traits<char>>(poVar1,", should be ",0xc);
                plVar2 = (long *)std::ostream::operator<<(poVar1,iVar6);
                std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
                std::ostream::put((char)plVar2);
                std::ostream::flush();
                std::ostream::flush();
                return bVar8;
              }
              uVar3 = uVar3 + 1;
            } while (uVar4 != uVar3);
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 != (uint)width);
      }
      bVar8 = height - 1 <= uVar7;
      uVar7 = uVar7 + 1;
    } while (uVar7 != (uint)height);
  }
  return true;
}

Assistant:

bool
checkPixels (
    Array2D<unsigned int>& sampleCount, Array2D<T*>& ph, int width, int height)
{
    return checkPixels<T> (sampleCount, ph, 0, width - 1, 0, height - 1, width);
}